

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_field_descs(t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  bool bVar1;
  int32_t iVar2;
  ostream *poVar3;
  reference pptVar4;
  string *psVar5;
  t_type *type;
  string local_b0;
  string local_80;
  string local_60;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_40;
  t_field **local_38;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_30;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  t_struct *tstruct_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_30);
  local_38 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_30._M_current = local_38;
  while( true ) {
    local_40._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"private static final TField ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
    std::__cxx11::string::string((string *)&local_80,(string *)psVar5);
    constant_name(&local_60,this,&local_80);
    poVar3 = std::operator<<(poVar3,(string *)&local_60);
    poVar3 = std::operator<<(poVar3,"_FIELD_DESC = new TField(\"");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
    poVar3 = std::operator<<(poVar3,(string *)psVar5);
    poVar3 = std::operator<<(poVar3,"\", ");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    type = t_field::get_type(*pptVar4);
    type_to_enum_abi_cxx11_(&local_b0,this,type);
    poVar3 = std::operator<<(poVar3,(string *)&local_b0);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"(short)");
    pptVar4 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_30);
    iVar2 = t_field::get_key(*pptVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,");");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_30);
  }
  return;
}

Assistant:

void t_javame_generator::generate_field_descs(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    indent(out) << "private static final TField " << constant_name((*m_iter)->get_name())
                << "_FIELD_DESC = new TField(\"" << (*m_iter)->get_name() << "\", "
                << type_to_enum((*m_iter)->get_type()) << ", "
                << "(short)" << (*m_iter)->get_key() << ");" << endl;
  }
}